

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O1

_Bool rtosc_match_char(char **path,char **pattern)

{
  char cVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  char *pcVar8;
  byte bVar9;
  
  cVar1 = **path;
  pcVar8 = *pattern;
  cVar2 = *pcVar8;
  if (cVar1 == '\0' || cVar1 != cVar2) {
    if (cVar2 == '[') {
      *pattern = pcVar8 + 1;
      cVar2 = pcVar8[1];
      if (cVar2 == '!') {
        *pattern = pcVar8 + 2;
      }
      pcVar8 = *pattern;
      bVar6 = 0;
      bVar7 = 0;
      while ((cVar3 = *pcVar8, cVar3 != '\0' && (cVar3 != ']'))) {
        bVar9 = 1;
        bVar5 = 1;
        if ((cVar3 != cVar1) && (bVar9 = bVar7, bVar5 = bVar6, cVar3 == '-')) {
          *pattern = pcVar8 + 1;
          cVar3 = pcVar8[1];
          bVar4 = false;
          if ((cVar3 != '\0') && (bVar4 = false, cVar3 != ']')) {
            bVar7 = bVar6;
            if (cVar1 <= cVar3) {
              bVar7 = 1;
            }
            if (cVar1 < '-') {
              bVar7 = bVar6;
            }
            bVar4 = true;
            bVar6 = bVar7;
          }
          pcVar8 = pcVar8 + 1;
          bVar9 = bVar7;
          bVar5 = bVar6;
          if (!bVar4) break;
        }
        bVar6 = bVar5;
        pcVar8 = pcVar8 + 1;
        *pattern = pcVar8;
        bVar7 = bVar9;
      }
      if (**pattern == ']') {
        *pattern = *pattern + 1;
      }
      *path = *path + 1;
      return (_Bool)(cVar2 == '!' ^ bVar7);
    }
    if (cVar2 != '?') {
      return false;
    }
  }
  *path = *path + 1;
  *pattern = *pattern + 1;
  return true;
}

Assistant:

static bool rtosc_match_char(const char **path, const char **pattern)
{
    //printf("rtosc_match_char('%s','%s')\n", *path, *pattern);
    if(**path == **pattern && **path) {
        ++*path;
        ++*pattern;
        return true;
    } else if(**pattern == '?' && *path) {
        ++*path;
        ++*pattern;
        return true;
    } else if(**pattern == '[') {
        bool matched    = false;
        bool negation   = false;
        char last_range = '\0';
        char to_match   = **path;
        ++*pattern;
        if(**pattern == '!') {
            negation = true;
            ++*pattern;
        }
        while(**pattern && **pattern != ']') {
            last_range = **pattern;
            if(**pattern == to_match) {
                matched = true;
            } else if(**pattern == '-') {//range
                ++*pattern;
                char range_high = **pattern;
                if(range_high == ']' || !range_high)
                    break;
                if(to_match <= range_high && to_match >= last_range)
                    matched = true;
            }
            ++*pattern;
        }
        if(**pattern == ']')
            ++*pattern;
        ++*path;
        return negation ^ matched;
    }
    return false;
}